

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Parser::parseNumber(Parser *this)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Exception *this_00;
  char *msg;
  Builder *this_01;
  bool bVar5;
  undefined4 uVar10;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ParsedNumber numberValue;
  ParsedNumber exponent;
  
  sVar1 = this->_pos;
  numberValue.intValue = 0;
  numberValue.doubleValue = 0.0;
  numberValue.isInteger = true;
  iVar2 = consume(this);
  iVar3 = iVar2;
  if (iVar2 == 0x2d) {
    iVar3 = getOneOrThrow(this,"Incomplete number");
  }
  if (iVar3 - 0x3aU < 0xfffffff6) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Expecting digit";
LAB_00110640:
    Exception::Exception(this_00,ParseError,msg);
LAB_0011064b:
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if (iVar3 != 0x30) {
    this->_pos = this->_pos - 1;
    scanDigits(this,&numberValue);
  }
  uVar4 = consume(this);
  uVar10 = (undefined4)(numberValue.intValue >> 0x20);
  dVar7 = numberValue.doubleValue;
  if (-1 < (int)uVar4) {
    if ((uVar4 & 0x7fffffdf) == 0x45 || uVar4 == 0x2e) {
      if (uVar4 != 0x2e) {
        if (numberValue.isInteger != false) {
          auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)numberValue.intValue);
          auVar8._8_4_ = uVar10;
          auVar8._12_4_ = 0x45300000;
          dVar7 = (auVar8._0_8_ - 4503599627370496.0) + (auVar8._8_8_ - 1.9342813113834067e+25);
        }
        if (iVar2 == 0x2d) {
          dVar7 = -dVar7;
        }
LAB_001104c3:
        if ((uVar4 & 0x7fffffdf) == 0x45) {
          iVar3 = getOneOrThrow(this,"Incomplete number");
          if ((iVar3 == 0x2d) || (iVar3 == 0x2b)) {
            bVar5 = iVar3 == 0x2d;
            iVar3 = getOneOrThrow(this,"Incomplete number");
          }
          else {
            bVar5 = false;
          }
          if (iVar3 - 0x3aU < 0xfffffff6) goto LAB_0011062e;
          this->_pos = this->_pos - 1;
          exponent.intValue = 0;
          exponent.doubleValue = 0.0;
          exponent.isInteger = true;
          scanDigits(this,&exponent);
          dVar6 = exponent.doubleValue;
          if (exponent.isInteger != false) {
            dVar6 = ((double)CONCAT44(0x43300000,(int)exponent.intValue) - 4503599627370496.0) +
                    ((double)CONCAT44(0x45300000,(int)(exponent.intValue >> 0x20)) -
                    1.9342813113834067e+25);
          }
          if (bVar5) {
            dVar6 = -dVar6;
          }
          dVar6 = pow(10.0,dVar6);
          if (0x7fefffffffffffff < (long)ABS(dVar7 * dVar6)) {
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception(this_00,NumberOutOfRange);
            goto LAB_0011064b;
          }
        }
        else {
          this->_pos = this->_pos - 1;
        }
        this_01 = this->_builderPtr;
        dVar7 = atof((char *)(this->_start + sVar1));
        goto LAB_001105ec;
      }
      iVar3 = getOneOrThrow(this,"Incomplete number");
      if (0xfffffff5 < iVar3 - 0x3aU) {
        this->_pos = this->_pos - 1;
        dVar6 = scanDigitsFractional(this);
        dVar7 = numberValue.doubleValue;
        if (numberValue.isInteger != false) {
          dVar7 = ((double)CONCAT44(0x43300000,(int)numberValue.intValue) - 4503599627370496.0) +
                  ((double)CONCAT44(0x45300000,(int)(numberValue.intValue >> 0x20)) -
                  1.9342813113834067e+25);
        }
        if (iVar2 == 0x2d) {
          dVar7 = -dVar7 - dVar6;
        }
        else {
          dVar7 = dVar7 + dVar6;
        }
        uVar4 = consume(this);
        if ((int)uVar4 < 0) {
          this_01 = this->_builderPtr;
          goto LAB_001105ec;
        }
        goto LAB_001104c3;
      }
LAB_0011062e:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Incomplete number";
      goto LAB_00110640;
    }
    this->_pos = this->_pos - 1;
  }
  if (numberValue.isInteger == false) {
    this_01 = this->_builderPtr;
    if (iVar2 != 0x2d) goto LAB_001105ec;
  }
  else {
    if (iVar2 != 0x2d) {
      Builder::addUInt(this->_builderPtr,numberValue.intValue);
      return;
    }
    if (-1 < (long)numberValue.intValue) {
      Builder::addInt(this->_builderPtr,-numberValue.intValue);
      return;
    }
    this_01 = this->_builderPtr;
    auVar9._8_4_ = uVar10;
    auVar9._0_8_ = numberValue.intValue;
    auVar9._12_4_ = 0x45300000;
    dVar7 = ((double)CONCAT44(0x43300000,(int)numberValue.intValue) - 4503599627370496.0) +
            (auVar9._8_8_ - 1.9342813113834067e+25);
  }
  dVar7 = -dVar7;
LAB_001105ec:
  Builder::addDouble(this_01,dVar7);
  return;
}

Assistant:

void Parser::parseNumber() {
  std::size_t startPos = _pos;
  ParsedNumber numberValue;
  bool negative = false;
  int i = consume();
  // We know that a character is coming, and it's a number if it
  // starts with '-' or a digit. otherwise it's invalid
  if (i == '-') {
    i = getOneOrThrow("Incomplete number");
    negative = true;
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Expecting digit");
  }

  if (i != '0') {
    unconsume();
    scanDigits(numberValue);
  }
  i = consume();
  if (i < 0 || (i != '.' && i != 'e' && i != 'E')) {
    if (i >= 0) {
      unconsume();
    }
    if (!numberValue.isInteger) {
      if (negative) {
        _builderPtr->addDouble(-numberValue.doubleValue);
      } else {
        _builderPtr->addDouble(numberValue.doubleValue);
      }
    } else if (negative) {
      if (numberValue.intValue <= static_cast<uint64_t>(INT64_MAX)) {
        _builderPtr->addInt(-static_cast<int64_t>(numberValue.intValue));
      } else if (numberValue.intValue == toUInt64(INT64_MIN)) {
        _builderPtr->addInt(INT64_MIN);
      } else {
        _builderPtr->addDouble(-static_cast<double>(numberValue.intValue));
      }
    } else {
      _builderPtr->addUInt(numberValue.intValue);
    }
    return;
  }

  double fractionalPart;
  if (i == '.') {
    // fraction. skip over '.'
    i = getOneOrThrow("Incomplete number");
    if (i < '0' || i > '9') {
      throw Exception(Exception::ParseError, "Incomplete number");
    }
    unconsume();
    fractionalPart = scanDigitsFractional();
    if (negative) {
      fractionalPart = -numberValue.asDouble() - fractionalPart;
    } else {
      fractionalPart = numberValue.asDouble() + fractionalPart;
    }
    i = consume();
    if (i < 0) {
      _builderPtr->addDouble(fractionalPart);
      return;
    }
  } else {
    if (negative) {
      fractionalPart = -numberValue.asDouble();
    } else {
      fractionalPart = numberValue.asDouble();
    }
  }
  if (i != 'e' && i != 'E') {
    unconsume();
    // use conventional atof() conversion here, to avoid precision loss
    // when interpreting and multiplying the single digits of the input stream
    // _builderPtr->addDouble(fractionalPart);
    _builderPtr->addDouble(
        atof(reinterpret_cast<char const*>(_start) + startPos));
    return;
  }
  i = getOneOrThrow("Incomplete number");
  negative = false;
  if (i == '+' || i == '-') {
    negative = (i == '-');
    i = getOneOrThrow("Incomplete number");
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Incomplete number");
  }
  unconsume();
  ParsedNumber exponent;
  scanDigits(exponent);
  if (negative) {
    fractionalPart *= pow(10, -exponent.asDouble());
  } else {
    fractionalPart *= pow(10, exponent.asDouble());
  }
  if (std::isnan(fractionalPart) || !std::isfinite(fractionalPart)) {
    throw Exception(Exception::NumberOutOfRange);
  }
  // use conventional atof() conversion here, to avoid precision loss
  // when interpreting and multiplying the single digits of the input stream
  // _builderPtr->addDouble(fractionalPart);
  _builderPtr->addDouble(
      atof(reinterpret_cast<char const*>(_start) + startPos));
}